

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O2

int ConvolutionReverb::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x2c0);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Wet","%",0.0,100.0,30.0,1.0,1.0,0,"Wet signal mix amount");
  RegisterParameter(definition,"Gain","dB",-50.0,50.0,0.0,1.0,1.0,1,"Overall impulse response gain")
  ;
  RegisterParameter(definition,"Time","s",0.01,15.0,2.0,1.0,3.0,2,
                    "Length of synthetic impulse response");
  RegisterParameter(definition,"Decay","%",0.01,100.0,50.0,1.0,3.0,3,
                    "Decay time of synthetic impulse response and filter curve");
  RegisterParameter(definition,"Diffusion","%",0.0,100.0,100.0,1.0,1.0,4,
                    "Diffusiveness of synthetic impulse response");
  RegisterParameter(definition,"StereoSpread","%",0.0,100.0,30.0,1.0,1.0,5,
                    "Stereo width of synthetic impulse response");
  RegisterParameter(definition,"Cut High","Hz",1.0,20000.0,10000.0,1.0,3.0,6,
                    "High cutoff of filter decay curve (applied both to synthetic and sample impulse responses)"
                   );
  RegisterParameter(definition,"Cut Low","Hz",1.0,20000.0,8000.0,1.0,3.0,7,
                    "Low cutoff of filter decay curve (applied both to synthetic and sample impulse responses)"
                   );
  RegisterParameter(definition,"Resonance","%",0.0,1.0,0.0,100.0,3.0,8,
                    "Resonance amount of filter (applied both to synthetic and sample impulse responses)"
                   );
  RegisterParameter(definition,"Use Sample","",-1.0,15.0,-1.0,1.0,1.0,9,
                    "-1 = use synthetic impulse response, otherwise indicates the slot of a sample uploaded by scripts via ConvolutionReverb_UploadSample"
                   );
  RegisterParameter(definition,"Reverse","",0.0,1.0,0.0,1.0,1.0,10,
                    "Reverse impulse response for scary effects ;-)");
  return 0xb;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Wet", "%", 0.0f, 100.0f, 30.0f, 1.0f, 1.0f, P_WET, "Wet signal mix amount");
        RegisterParameter(definition, "Gain", "dB", -50.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN, "Overall impulse response gain");
        RegisterParameter(definition, "Time", "s", 0.01f, MAXLENGTH, 2.0f, 1.0f, 3.0f, P_TIME, "Length of synthetic impulse response");
        RegisterParameter(definition, "Decay", "%", 0.01f, 100.0f, 50.0f, 1.0f, 3.0f, P_DECAY, "Decay time of synthetic impulse response and filter curve");
        RegisterParameter(definition, "Diffusion", "%", 0.0f, 100.0f, 100.0f, 1.0f, 1.0f, P_DIFFUSION, "Diffusiveness of synthetic impulse response");
        RegisterParameter(definition, "StereoSpread", "%", 0.0f, 100.0f, 30.0f, 1.0f, 1.0f, P_STEREO, "Stereo width of synthetic impulse response");
        RegisterParameter(definition, "Cut High", "Hz", 1.0f, 20000.0f, 10000.0f, 1.0f, 3.0f, P_CUTHI, "High cutoff of filter decay curve (applied both to synthetic and sample impulse responses)");
        RegisterParameter(definition, "Cut Low", "Hz", 1.0f, 20000.0f, 8000.0f, 1.0f, 3.0f, P_CUTLO, "Low cutoff of filter decay curve (applied both to synthetic and sample impulse responses)");
        RegisterParameter(definition, "Resonance", "%", 0.0f, 1.0f, 0.0f, 100.0f, 3.0f, P_RESONANCE, "Resonance amount of filter (applied both to synthetic and sample impulse responses)");
        RegisterParameter(definition, "Use Sample", "", -1.0f, MAXSAMPLE - 1, -1.0f, 1.0f, 1.0f, P_USESAMPLE, "-1 = use synthetic impulse response, otherwise indicates the slot of a sample uploaded by scripts via ConvolutionReverb_UploadSample");
        RegisterParameter(definition, "Reverse", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_REVERSE, "Reverse impulse response for scary effects ;-)");
        return numparams;
    }